

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createLightSource_point(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  SP SVar5;
  vec3f vVar6;
  SP light;
  size_t N;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string name;
  affine3f transform;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::PointLightSource>();
  lVar1 = *in_RDX;
  transform.l.vx._0_8_ = *(undefined8 *)(lVar1 + 0x58);
  transform.l._8_8_ = *(undefined8 *)(lVar1 + 0x60);
  transform.l.vy._4_8_ = *(undefined8 *)(lVar1 + 0x68);
  transform.l.vz._0_8_ = *(undefined8 *)(lVar1 + 0x70);
  transform._32_8_ = *(undefined8 *)(lVar1 + 0x78);
  transform.p._4_8_ = *(undefined8 *)(lVar1 + 0x80);
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
  do {
    _Var2._M_pi = light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 0x10)) {
      light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"from");
    if (bVar3) {
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(*in_RDX + 8),
                 &((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->from).x,&name);
      vVar6 = math::operator*(&transform,
                              &(light.
                                super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->from);
      ((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->from).
      x = (float)(int)vVar6._0_8_;
      ((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->from).
      y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      ((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->from).
      z = vVar6.z;
    }
    else {
      bVar3 = std::operator==(&name,"scale");
      if (bVar3) {
        result = &(light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->scale;
      }
      else {
        bVar3 = std::operator==(&name,"I");
        if (!bVar3) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_d8,"unknown \'point\' light source param \'",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&N,
                         &local_d8,"\'");
          std::runtime_error::runtime_error(this_00,(string *)&N);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar3 = syntactic::ParamSet::hasParam3f((ParamSet *)(*in_RDX + 8),&name);
        if (!bVar3) {
          N = 0;
          syntactic::ParamSet::getParamPairNf((ParamSet *)(*in_RDX + 8),(value_type *)0x0,&N,&name);
          std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::resize
                    (&((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->Ispectrum).spd,N);
          syntactic::ParamSet::getParamPairNf
                    ((ParamSet *)(*in_RDX + 8),
                     ((light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->Ispectrum).spd.
                     super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&N,&name);
          goto LAB_0013d400;
        }
        result = &(light.super___shared_ptr<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->I;
      }
      syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),&result->x,&name);
    }
LAB_0013d400:
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_point
  (pbrt::syntactic::LightSource::SP in)
  {
    PointLightSource::SP light = std::make_shared<PointLightSource>();
    affine3f transform = in->transform.atStart;
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        light->from = xfmPoint(transform,light->from);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "I") {
        if (in->hasParam3f(name)) 
          in->getParam3f(&light->I.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          light->Ispectrum.spd.resize(N);
          in->getParamPairNf(light->Ispectrum.spd.data(),&N,name);
        }
        continue;
      }
      throw std::runtime_error("unknown 'point' light source param '"+name+"'");
    }
    
    return light;
  }